

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

uint64_t modinv2p64(uint64_t x)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar5;
  uint64_t uVar6;
  long lVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t extraout_RAX;
  uint64_t extraout_RAX_00;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar15;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar16;
  long lVar17;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar18;
  long *extraout_RDX_01;
  uint uVar19;
  uint uVar20;
  secp256k1_modinv32_modinfo *unaff_RBX;
  secp256k1_modinv32_modinfo *psVar21;
  secp256k1_modinv32_modinfo *psVar22;
  int *piVar23;
  secp256k1_modinv32_signed30 *psVar24;
  ulong unaff_RBP;
  ulong uVar25;
  uint64_t uVar26;
  uint uVar27;
  secp256k1_modinv32_modinfo *in_RSI;
  secp256k1_modinv32_signed30 *psVar28;
  secp256k1_fe *psVar29;
  ulong uVar30;
  secp256k1_fe *r;
  uint uVar31;
  secp256k1_modinv32_modinfo *psVar32;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar33;
  ulong uVar34;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar35;
  uchar *__s;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  secp256k1_modinv32_modinfo *psVar39;
  int *piVar40;
  uint uVar41;
  secp256k1_modinv32_modinfo *unaff_R12;
  ulong uVar42;
  secp256k1_modinv32_signed30 *psVar43;
  uint uVar44;
  secp256k1_modinv32_modinfo *unaff_R13;
  secp256k1_modinv32_modinfo *psVar45;
  secp256k1_modinv32_signed30 *psVar46;
  size_t count;
  uint uVar47;
  secp256k1_modinv32_modinfo *unaff_R14;
  secp256k1_modinv32_modinfo *psVar48;
  uint64_t uVar49;
  secp256k1_fe *a_03;
  uint uVar50;
  uint uVar51;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *psVar52;
  uint64_t uVar53;
  code *pcVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uStack_1650;
  secp256k1_fe *psStack_1648;
  uchar auStack_1640 [4232];
  secp256k1_fe *psStack_5b8;
  ulong uStack_5b0;
  uint64_t uStack_5a8;
  secp256k1_fe *psStack_5a0;
  code *pcStack_598;
  code *pcStack_590;
  undefined1 auStack_588 [36];
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  undefined1 auStack_548 [48];
  code *pcStack_518;
  long lStack_508;
  secp256k1_fe sStack_500;
  secp256k1_fe *psStack_4c8;
  secp256k1_fe sStack_4c0;
  secp256k1_fe sStack_490;
  ulong uStack_458;
  ulong uStack_450;
  ulong uStack_448;
  secp256k1_modinv32_signed30 *psStack_440;
  ulong uStack_438;
  code *pcStack_430;
  uint uStack_428;
  uint uStack_424;
  uint uStack_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  secp256k1_modinv32_signed30 *psStack_410;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  uint uStack_3f8;
  int32_t iStack_3f4;
  secp256k1_modinv32_signed30 *psStack_3f0;
  secp256k1_modinv32_signed30 *psStack_3e8;
  secp256k1_modinv32_signed30 *psStack_3e0;
  secp256k1_modinv32_signed30 *psStack_3d8;
  secp256k1_modinv32_signed30 *psStack_3d0;
  code *pcStack_3c8;
  long lStack_3b8;
  long lStack_3b0;
  int *piStack_3a8;
  ulong uStack_3a0;
  secp256k1_modinv32_modinfo *psStack_398;
  secp256k1_modinv32_modinfo *psStack_388;
  code *pcStack_380;
  secp256k1_modinv32_signed30 *psStack_378;
  int *piStack_368;
  ulong uStack_360;
  secp256k1_modinv32_modinfo *psStack_358;
  secp256k1_modinv32_modinfo *psStack_348;
  code *pcStack_340;
  secp256k1_modinv32_signed30 sStack_338;
  secp256k1_modinv32_signed30 sStack_314;
  secp256k1_modinv32_modinfo *psStack_2f0;
  secp256k1_modinv32_modinfo *psStack_2e8;
  secp256k1_modinv32_modinfo *psStack_2d8;
  int iStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  secp256k1_modinv32_trans2x2 sStack_2c0;
  secp256k1_modinv32_modinfo sStack_2b0;
  secp256k1_modinv32_modinfo *psStack_288;
  long lStack_280;
  undefined8 uStack_278;
  secp256k1_modinv32_modinfo sStack_270;
  undefined1 auStack_240 [40];
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  secp256k1_modinv32_modinfo *psStack_1f8;
  ulong uStack_1f0;
  secp256k1_modinv32_modinfo *psStack_1e8;
  secp256k1_modinv32_modinfo *psStack_1e0;
  secp256k1_modinv32_modinfo *psStack_1d8;
  secp256k1_modinv32_modinfo *psStack_1d0;
  int iStack_1c4;
  secp256k1_modinv32_modinfo *psStack_1c0;
  secp256k1_modinv32_trans2x2 sStack_1b8;
  secp256k1_modinv32_modinfo sStack_1a8;
  secp256k1_modinv32_modinfo *psStack_178;
  undefined8 uStack_170;
  secp256k1_modinv32_modinfo sStack_168;
  undefined1 auStack_138 [40];
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  secp256k1_modinv32_modinfo *psStack_f0;
  secp256k1_modinv32_modinfo *psStack_e8;
  secp256k1_modinv32_modinfo *psStack_e0;
  secp256k1_modinv32_modinfo *psStack_d8;
  secp256k1_modinv32_modinfo *psStack_d0;
  code *pcStack_c8;
  secp256k1_modinv32_modinfo *psStack_c0;
  int iStack_b8;
  uint uStack_b4;
  secp256k1_modinv32_trans2x2 sStack_b0;
  secp256k1_modinv32_modinfo sStack_a0;
  int iStack_74;
  secp256k1_modinv32_modinfo sStack_70;
  secp256k1_modinv32_modinfo *psStack_40;
  
  if ((x & 1) != 0) {
    uVar6 = 1;
    iVar9 = 6;
    do {
      uVar6 = (2 - uVar6 * x) * uVar6;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    return uVar6;
  }
  modinv2p64_cold_1();
  sStack_70.modulus.v[8] = (in_RSI->modulus).v[8];
  sStack_70.modulus.v._0_8_ = *(undefined8 *)(in_RSI->modulus).v;
  sStack_70.modulus.v._8_8_ = *(undefined8 *)((in_RSI->modulus).v + 2);
  sStack_70.modulus.v._16_8_ = *(undefined8 *)((in_RSI->modulus).v + 4);
  sStack_70.modulus.v._24_8_ = *(undefined8 *)((in_RSI->modulus).v + 6);
  uVar3 = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_a0.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  piVar16 = (((secp256k1_modinv32_modinfo *)x)->modulus).v + 4;
  sStack_a0.modulus.v._16_8_ = *(undefined8 *)piVar16;
  sStack_a0.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  sStack_a0.modulus.v[0] = (int32_t)uVar3;
  sStack_a0.modulus.v[1] = (int32_t)((ulong)uVar3 >> 0x20);
  sStack_a0.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  auVar59 = packssdw(*(undefined1 (*) [16])(((secp256k1_modinv32_modinfo *)x)->modulus).v,
                     *(undefined1 (*) [16])piVar16);
  if (((((((((auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]) &&
     (-1 < sStack_a0.modulus.v[8])) {
    uVar27 = sStack_a0.modulus.v[3] | sStack_a0.modulus.v[2] |
             sStack_a0.modulus.v[1] | sStack_a0.modulus.v[0];
    psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
    psVar32 = unaff_R12;
    psVar22 = in_RSI;
    if ((sStack_a0.modulus.v[7] != 0 ||
        ((sStack_a0.modulus.v[6] != 0 ||
         (sStack_a0.modulus.v[5] != 0 || sStack_a0.modulus.v[4] != 0)) || uVar27 != 0)) ||
        sStack_a0.modulus.v[8] != 0) {
      psStack_c0 = (secp256k1_modinv32_modinfo *)0x9;
      unaff_RBP = 0xffffffff;
      iStack_b8 = 0;
      unaff_RBX = (secp256k1_modinv32_modinfo *)(sStack_70.modulus.v._0_8_ & 0xffffffff);
      unaff_R15 = (secp256k1_modinv32_modinfo *)0x0;
      psStack_40 = in_RSI;
      do {
        psVar22 = psStack_40;
        psVar32 = psStack_c0;
        uStack_b4 = sStack_a0.modulus.v[1] << 0x1e | sStack_a0.modulus.v[0];
        uVar41 = sStack_70.modulus.v[1] << 0x1e | (uint)unaff_RBX;
        unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
        uVar27 = 1;
        psVar52 = (secp256k1_modinv32_modinfo *)0x0;
        uVar4 = 0x1e;
        x = 0;
        uVar36 = 1;
        unaff_RBX = unaff_R12;
        uVar38 = uStack_b4;
        while( true ) {
          unaff_R14 = unaff_R15;
          in_RSI = (secp256k1_modinv32_modinfo *)(ulong)uStack_b4;
          unaff_R13 = &sStack_a0;
          uVar44 = (uint)unaff_RBX;
          uVar19 = -1 << ((byte)uVar4 & 0x1f) | uVar38;
          uVar10 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          bVar8 = (byte)uVar10;
          uVar38 = uVar38 >> (bVar8 & 0x1f);
          uVar36 = uVar36 << (bVar8 & 0x1f);
          uVar31 = (int)x << (bVar8 & 0x1f);
          x = (uint64_t)uVar31;
          uVar19 = (int)unaff_RBP - uVar10;
          unaff_RBP = (ulong)uVar19;
          psVar21 = (secp256k1_modinv32_modinfo *)((ulong)unaff_RBX >> 1);
          uVar50 = ((uint)((ulong)unaff_RBX >> 2) ^ (uint)psVar21) & uVar10 ^ (uint)unaff_R14;
          unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar50;
          uVar4 = uVar4 - uVar10;
          uVar10 = (uint)psVar52;
          if (uVar4 == 0) break;
          if (((ulong)unaff_RBX & 1) == 0) {
            pcStack_c8 = (code *)0x15329b;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0015329b:
            pcStack_c8 = (code *)0x1532a0;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_001532a0:
            pcStack_c8 = (code *)0x1532a5;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_001532a5:
            unaff_RBX = psVar21;
            pcStack_c8 = (code *)0x1532aa;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar52 = unaff_R12;
LAB_001532aa:
            unaff_R12 = psVar52;
            pcStack_c8 = (code *)0x1532af;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_001532af;
          }
          if ((uVar38 & 1) == 0) goto LAB_0015329b;
          uVar20 = uVar31 * uStack_b4 + uVar36 * uVar41;
          psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uVar20;
          bVar8 = 0x1e - (char)uVar4;
          uVar47 = uVar44 << (bVar8 & 0x1f);
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar47;
          if (uVar20 != uVar47) goto LAB_001532a0;
          uVar47 = uVar27 * uStack_b4 + uVar10 * uVar41;
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar47;
          uVar20 = uVar38 << (bVar8 & 0x1f);
          psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uVar20;
          if (uVar47 != uVar20) goto LAB_001532a5;
          unaff_R14 = psVar52;
          if ((int)uVar19 < 0) {
            unaff_RBP = (ulong)-uVar19;
            unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)(uVar50 ^ (uVar38 & uVar44) >> 1);
            unaff_RBX = (secp256k1_modinv32_modinfo *)(ulong)uVar38;
            x = (uint64_t)uVar27;
            unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar36;
            uVar36 = uVar10;
            uVar38 = uVar44;
            uVar27 = uVar31;
          }
          uVar10 = (int)unaff_RBP + 1;
          if ((int)uVar4 <= (int)uVar10) {
            uVar10 = uVar4;
          }
          in_RSI = unaff_R12;
          psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
          if (0x1e < uVar10) goto LAB_001532aa;
          uVar44 = (uint)(0xff << (-(char)uVar10 & 0x1fU)) >> (-(char)uVar10 & 0x1fU);
          uVar10 = secp256k1_modinv32_inv256[(uint)((ulong)unaff_RBX >> 1) & 0x7f] * uVar38 & uVar44
          ;
          uVar38 = uVar10 * (int)unaff_RBX + uVar38;
          psVar52 = (secp256k1_modinv32_modinfo *)(ulong)(uVar10 * uVar36 + (int)unaff_R14);
          uVar27 = uVar10 * (int)x + uVar27;
          in_RSI = (secp256k1_modinv32_modinfo *)(ulong)uStack_b4;
          if ((uVar38 & uVar44) != 0) {
LAB_001532af:
            unaff_R13 = &sStack_a0;
            pcStack_c8 = (code *)0x1532b4;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_001532b4;
          }
        }
        lVar7 = (long)(int)uVar27 * (long)(int)uVar36 - (long)(int)uVar10 * (long)(int)uVar31;
        unaff_RBX = &sStack_70;
        sStack_b0.u = uVar36;
        sStack_b0.v = uVar31;
        sStack_b0.q = uVar10;
        sStack_b0.r = uVar27;
        if ((lVar7 != -0x40000000) && (lVar7 != 0x40000000)) goto LAB_001532e6;
        iVar11 = (int)psStack_c0;
        in_RSI = (secp256k1_modinv32_modinfo *)((ulong)psStack_c0 & 0xffffffff);
        pcStack_c8 = (code *)0x153138;
        x = (uint64_t)unaff_RBX;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_RBX->modulus,iVar11,&psStack_40->modulus,0);
        if (iVar9 < 1) goto LAB_001532b9;
        in_RSI = (secp256k1_modinv32_modinfo *)((ulong)psVar32 & 0xffffffff);
        pcStack_c8 = (code *)0x153153;
        x = (uint64_t)unaff_RBX;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_RBX->modulus,iVar11,&psVar22->modulus,1);
        if (0 < iVar9) goto LAB_001532be;
        in_RSI = (secp256k1_modinv32_modinfo *)((ulong)psVar32 & 0xffffffff);
        pcStack_c8 = (code *)0x15316b;
        x = (uint64_t)unaff_R13;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,0);
        if (iVar9 < 1) goto LAB_001532c3;
        in_RSI = (secp256k1_modinv32_modinfo *)((ulong)psVar32 & 0xffffffff);
        pcStack_c8 = (code *)0x153186;
        x = (uint64_t)unaff_R13;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,1);
        if (-1 < iVar9) goto LAB_001532c8;
        pcStack_c8 = (code *)0x1531a1;
        secp256k1_modinv32_update_fg_30_var
                  (iVar11,&unaff_RBX->modulus,&unaff_R13->modulus,&sStack_b0);
        unaff_RBX = (secp256k1_modinv32_modinfo *)(sStack_70.modulus.v._0_8_ & 0xffffffff);
        if (sStack_70.modulus.v[0] == 1) {
          if (1 < iVar11) {
            uVar27 = 0;
            uVar42 = 1;
            do {
              uVar27 = uVar27 | sStack_70.modulus.v[uVar42];
              uVar42 = uVar42 + 1;
            } while (((ulong)psVar32 & 0xffffffff) != uVar42);
            psVar32 = psStack_c0;
            if (uVar27 != 0) goto LAB_001531d6;
          }
          uVar27 = 1 - (uVar50 * 2 & 2);
          goto LAB_00153284;
        }
LAB_001531d6:
        iVar9 = (int)psVar32;
        psVar32 = (secp256k1_modinv32_modinfo *)((ulong)psVar32 & 0xffffffff);
        if ((-1 < iVar9 + -2 && (&iStack_74)[iVar9] == 0) &&
            sStack_a0.modulus.v[(long)iVar9 + -1] == 0) {
          psVar32 = (secp256k1_modinv32_modinfo *)(ulong)(iVar9 - 1);
        }
        unaff_R13 = &sStack_70;
        pcStack_c8 = (code *)0x153207;
        iVar11 = (int)psVar32;
        in_RSI = psVar32;
        x = (uint64_t)unaff_R13;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,0);
        if (iVar9 < 1) goto LAB_001532cd;
        pcStack_c8 = (code *)0x153222;
        in_RSI = psVar32;
        x = (uint64_t)unaff_R13;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,1);
        if (0 < iVar9) goto LAB_001532d2;
        unaff_R13 = &sStack_a0;
        pcStack_c8 = (code *)0x15323f;
        in_RSI = psVar32;
        x = (uint64_t)unaff_R13;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,0);
        if (iVar9 < 1) goto LAB_001532d7;
        pcStack_c8 = (code *)0x15325e;
        in_RSI = psVar32;
        x = (uint64_t)unaff_R13;
        psStack_c0 = psVar32;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar11,&psVar22->modulus,1);
        if (-1 < iVar9) goto LAB_001532dc;
        iStack_b8 = iStack_b8 + 1;
        if (iStack_b8 == 0x19) {
          uVar27 = 0;
LAB_00153284:
          return (ulong)uVar27;
        }
      } while( true );
    }
  }
  else {
LAB_001532b4:
    pcStack_c8 = (code *)0x1532b9;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar32 = unaff_R12;
    psVar22 = unaff_R14;
LAB_001532b9:
    pcStack_c8 = (code *)0x1532be;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_001532be:
    pcStack_c8 = (code *)0x1532c3;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_001532c3:
    pcStack_c8 = (code *)0x1532c8;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_001532c8:
    pcStack_c8 = (code *)0x1532cd;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_001532cd:
    pcStack_c8 = (code *)0x1532d2;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_001532d2:
    pcStack_c8 = (code *)0x1532d7;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_001532d7:
    pcStack_c8 = (code *)0x1532dc;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_001532dc:
    pcStack_c8 = (code *)0x1532e1;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar52 = in_RSI;
  }
  in_RSI = psVar52;
  pcStack_c8 = (code *)0x1532e6;
  secp256k1_jacobi32_maybe_var_cold_16();
  psStack_40 = psVar22;
LAB_001532e6:
  pcStack_c8 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_c8 = (code *)unaff_RBP;
  psStack_d0 = unaff_R15;
  psStack_d8 = psStack_40;
  psStack_e0 = unaff_R13;
  psStack_e8 = psVar32;
  psStack_f0 = unaff_RBX;
  auStack_138._16_4_ = 0;
  auStack_138._20_4_ = 0;
  auStack_138._24_4_ = 0;
  auStack_138._28_4_ = 0;
  auStack_138._0_4_ = 0;
  auStack_138._4_4_ = 0;
  auStack_138._8_4_ = 0;
  auStack_138._12_4_ = 0;
  auStack_138._32_4_ = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  auStack_138._36_4_ = 1;
  sStack_1a8.modulus.v[8] = (in_RSI->modulus).v[8];
  uStack_170 = in_RSI;
  sStack_1a8.modulus.v._16_8_ = *(undefined8 *)((in_RSI->modulus).v + 4);
  sStack_1a8.modulus.v._24_8_ = *(undefined8 *)((in_RSI->modulus).v + 6);
  sStack_1a8.modulus.v._0_8_ = *(ulong *)(in_RSI->modulus).v;
  sStack_1a8.modulus.v._8_8_ = *(undefined8 *)((in_RSI->modulus).v + 2);
  sStack_168.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  sStack_168.modulus.v._0_8_ = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_168.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  psStack_178 = (secp256k1_modinv32_modinfo *)x;
  sStack_168.modulus.v._16_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 4);
  sStack_168.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  iStack_1c4 = 0;
  uVar42 = 0xffffffff;
  psStack_1c0 = (secp256k1_modinv32_modinfo *)0x9;
LAB_00153380:
  psVar22 = uStack_170;
  psVar52 = psStack_1c0;
  psVar45 = (secp256k1_modinv32_modinfo *)(sStack_1a8.modulus.v._0_8_ & 0xffffffff);
  psVar32 = (secp256k1_modinv32_modinfo *)(sStack_168.modulus.v._0_8_ & 0xffffffff);
  uVar27 = 1;
  psVar39 = (secp256k1_modinv32_modinfo *)0x0;
  iVar9 = 0x1e;
  uVar4 = 0;
  psVar21 = (secp256k1_modinv32_modinfo *)0x1;
  uVar36 = sStack_1a8.modulus.v[0];
  uVar38 = sStack_168.modulus.v[0];
  while( true ) {
    uVar41 = -1 << ((byte)iVar9 & 0x1f) | uVar38;
    iVar11 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
      }
    }
    bVar8 = (byte)iVar11;
    uVar38 = uVar38 >> (bVar8 & 0x1f);
    uVar10 = (int)psVar21 << (bVar8 & 0x1f);
    psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
    uVar4 = uVar4 << (bVar8 & 0x1f);
    uVar44 = (int)uVar42 - iVar11;
    uVar42 = (ulong)uVar44;
    iVar9 = iVar9 - iVar11;
    iVar11 = (int)psVar39;
    if (iVar9 == 0) break;
    if ((uVar36 & 1) == 0) {
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537a7;
      secp256k1_modinv32_var_cold_7();
LAB_001537a7:
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537ac;
      secp256k1_modinv32_var_cold_6();
LAB_001537ac:
      psVar48 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537b1;
      secp256k1_modinv32_var_cold_1();
LAB_001537b1:
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537b6;
      secp256k1_modinv32_var_cold_2();
LAB_001537b6:
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537bb;
      secp256k1_modinv32_var_cold_5();
LAB_001537bb:
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537c0;
      secp256k1_modinv32_var_cold_4();
      goto LAB_001537c0;
    }
    if ((uVar38 & 1) == 0) goto LAB_001537a7;
    uVar41 = uVar4 * sStack_168.modulus.v[0] + uVar10 * sStack_1a8.modulus.v[0];
    bVar8 = 0x1e - (char)iVar9;
    uVar19 = uVar36 << (bVar8 & 0x1f);
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar19;
    if (uVar41 != uVar19) goto LAB_001537ac;
    uVar41 = uVar27 * sStack_168.modulus.v[0] + iVar11 * sStack_1a8.modulus.v[0];
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
    uVar19 = uVar38 << (bVar8 & 0x1f);
    psVar48 = (secp256k1_modinv32_modinfo *)(ulong)uVar19;
    if (uVar41 != uVar19) goto LAB_001537b1;
    if (uVar44 - 0x2f0 < 0xfffffa21) goto LAB_001537b6;
    psVar48 = psVar39;
    if ((int)uVar44 < 0) {
      uVar42 = (ulong)-uVar44;
      uVar41 = -uVar36;
      uVar44 = -uVar4;
      psVar21 = psVar39;
      psVar48 = (secp256k1_modinv32_modinfo *)(ulong)-uVar10;
      uVar36 = uVar38;
      uVar38 = uVar41;
      uVar4 = uVar27;
      uVar27 = uVar44;
    }
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
    iVar11 = (int)uVar42 + 1;
    if (iVar9 <= iVar11) {
      iVar11 = iVar9;
    }
    if (iVar11 - 0x1fU < 0xffffffe2) goto LAB_001537bb;
    uVar10 = (uint)(0xff << (-(char)iVar11 & 0x1fU)) >> (-(char)iVar11 & 0x1fU);
    unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
    uVar41 = secp256k1_modinv32_inv256[uVar36 >> 1 & 0x7f] * uVar38 & uVar10;
    uVar38 = uVar38 + uVar41 * uVar36;
    psVar39 = (secp256k1_modinv32_modinfo *)(ulong)(uVar41 * (int)psVar21 + (int)psVar48);
    uVar27 = uVar41 * uVar4 + uVar27;
    if ((uVar38 & uVar10) != 0) {
LAB_001537c0:
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537c5;
      secp256k1_modinv32_var_cold_3();
      psVar52 = psVar48;
      goto LAB_001537c5;
    }
  }
  sStack_1b8.u = uVar10;
  sStack_1b8.v = uVar4;
  sStack_1b8.q = iVar11;
  sStack_1b8.r = uVar27;
  if ((long)(int)uVar27 * (long)(int)uVar10 - (long)iVar11 * (long)(int)uVar4 == 0x40000000) {
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153526;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_138,
               (secp256k1_modinv32_signed30 *)(auStack_138 + 0x24),&sStack_1b8,uStack_170);
    unaff_R15 = &sStack_1a8;
    iVar11 = (int)psVar52;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x15353e;
    psVar45 = psVar52;
    psVar32 = unaff_R15;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&psVar22->modulus,-1);
    if (iVar9 < 1) goto LAB_001537ca;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153559;
    psVar45 = psVar52;
    psVar32 = unaff_R15;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&psVar22->modulus,1);
    if (0 < iVar9) goto LAB_001537cf;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153574;
    psVar45 = psVar52;
    psVar32 = &sStack_168;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_168.modulus,iVar11,&psVar22->modulus,-1);
    if (iVar9 < 1) goto LAB_001537d4;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x15358f;
    psVar45 = psVar52;
    psVar32 = &sStack_168;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_168.modulus,iVar11,&psVar22->modulus,1);
    if (-1 < iVar9) goto LAB_001537d9;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1535ac;
    secp256k1_modinv32_update_fg_30_var(iVar11,&sStack_1a8.modulus,&sStack_168.modulus,&sStack_1b8);
    if (sStack_168.modulus.v[0] == 0) {
      if (1 < iVar11) {
        uVar27 = 0;
        psVar32 = (secp256k1_modinv32_modinfo *)0x1;
        do {
          uVar27 = uVar27 | sStack_168.modulus.v[(long)psVar32];
          psVar32 = (secp256k1_modinv32_modinfo *)((long)(psVar32->modulus).v + 1);
        } while (psVar52 != psVar32);
        if (uVar27 != 0) goto LAB_001535db;
      }
      psVar32 = &sStack_168;
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1536b7;
      psVar45 = psVar52;
      iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,iVar11,&SECP256K1_SIGNED30_ONE,0);
      psVar21 = psVar52;
      if (iVar9 != 0) goto LAB_001537f7;
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1536d8;
      iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_1a8.modulus,iVar11,&SECP256K1_SIGNED30_ONE,-1);
      psVar21 = psStack_178;
      if (iVar9 != 0) {
        psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1536fd;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_1a8.modulus,iVar11,&SECP256K1_SIGNED30_ONE,1);
        if (iVar9 != 0) {
          psVar45 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153717;
          psVar32 = psVar21;
          iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar9 != 0) goto LAB_001537fc;
          psVar32 = (secp256k1_modinv32_modinfo *)auStack_138;
          psVar45 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_1d0 = (secp256k1_modinv32_modinfo *)0x15373a;
          iVar9 = secp256k1_modinv32_mul_cmp_30
                            ((secp256k1_modinv32_signed30 *)psVar32,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar9 != 0) goto LAB_001537fc;
          psVar32 = &sStack_1a8;
          psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153757;
          psVar45 = psVar52;
          iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,iVar11,&psVar22->modulus,1);
          if (iVar9 != 0) goto LAB_001537fc;
        }
      }
      psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153779;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_138,sStack_1a8.modulus.v[(long)iVar11 + -1],
                 psVar22);
      (psVar21->modulus).v[8] = auStack_138._32_4_;
      *(undefined8 *)((psVar21->modulus).v + 4) = auStack_138._16_8_;
      *(undefined8 *)((psVar21->modulus).v + 6) = auStack_138._24_8_;
      *(undefined8 *)(psVar21->modulus).v = auStack_138._0_8_;
      *(undefined8 *)((psVar21->modulus).v + 2) = auStack_138._8_8_;
      return (ulong)(uint)auStack_138._32_4_;
    }
LAB_001535db:
    uVar27 = sStack_1a8.modulus.v[(long)iVar11 + -1];
    uVar36 = *(uint *)((long)&uStack_170 + (long)iVar11 * 4 + 4);
    iVar9 = iVar11 + -2;
    uVar38 = (int)uVar27 >> 0x1f ^ uVar27 | iVar9 >> 0x1f;
    psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar38;
    uVar38 = (int)uVar36 >> 0x1f ^ uVar36 | uVar38;
    psVar45 = (secp256k1_modinv32_modinfo *)(ulong)uVar38;
    if (uVar38 == 0) {
      psVar52 = (secp256k1_modinv32_modinfo *)(ulong)(iVar11 - 1);
      piVar16 = sStack_1a8.modulus.v + iVar9;
      *piVar16 = *piVar16 | uVar27 << 0x1e;
      piVar16 = sStack_168.modulus.v + iVar9;
      *piVar16 = *piVar16 | uVar36 << 0x1e;
    }
    unaff_R15 = &sStack_1a8;
    if (iStack_1c4 == 0x18) goto LAB_001537de;
    iVar11 = (int)psVar52;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x15363a;
    psVar45 = psVar52;
    psVar32 = unaff_R15;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&psVar22->modulus,-1);
    if (iVar9 < 1) goto LAB_001537e3;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153655;
    psVar45 = psVar52;
    psVar32 = unaff_R15;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&psVar22->modulus,1);
    if (0 < iVar9) goto LAB_001537e8;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x153670;
    psVar45 = psVar52;
    psVar32 = &sStack_168;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_168.modulus,iVar11,&psVar22->modulus,-1);
    if (iVar9 < 1) goto LAB_001537ed;
    psStack_1d0 = (secp256k1_modinv32_modinfo *)0x15368b;
    psVar45 = psVar52;
    psVar32 = &sStack_168;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_168.modulus,iVar11,&psVar22->modulus,1);
    if (-1 < iVar9) goto LAB_001537f2;
    iStack_1c4 = iStack_1c4 + 1;
    psStack_1c0 = psVar52;
    goto LAB_00153380;
  }
LAB_001537c5:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537ca;
  secp256k1_modinv32_var_cold_8();
  psVar22 = psVar21;
LAB_001537ca:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537cf;
  secp256k1_modinv32_var_cold_19();
LAB_001537cf:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537d4;
  secp256k1_modinv32_var_cold_18();
LAB_001537d4:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537d9;
  secp256k1_modinv32_var_cold_17();
LAB_001537d9:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537de;
  secp256k1_modinv32_var_cold_16();
LAB_001537de:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537e3;
  secp256k1_modinv32_var_cold_13();
LAB_001537e3:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537e8;
  secp256k1_modinv32_var_cold_12();
LAB_001537e8:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537ed;
  secp256k1_modinv32_var_cold_11();
LAB_001537ed:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537f2;
  secp256k1_modinv32_var_cold_10();
LAB_001537f2:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537f7;
  secp256k1_modinv32_var_cold_9();
  psVar21 = psVar52;
LAB_001537f7:
  psVar52 = unaff_R15;
  psStack_1d0 = (secp256k1_modinv32_modinfo *)0x1537fc;
  secp256k1_modinv32_var_cold_14();
LAB_001537fc:
  psStack_1d0 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_1d0 = &sStack_168;
  psStack_1d8 = psVar52;
  psStack_1e0 = psVar21;
  psStack_1e8 = unaff_R13;
  uStack_1f0 = uVar42;
  psStack_1f8 = psVar22;
  auStack_240._16_4_ = 0;
  auStack_240._20_4_ = 0;
  auStack_240._24_4_ = 0;
  auStack_240._28_4_ = 0;
  auStack_240._0_4_ = 0;
  auStack_240._4_4_ = 0;
  auStack_240._8_4_ = 0;
  auStack_240._12_4_ = 0;
  auStack_240._32_4_ = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  auStack_240._36_4_ = 1;
  sStack_2b0.modulus.v[8] = (psVar45->modulus).v[8];
  sStack_2b0.modulus.v._16_8_ = *(undefined8 *)((psVar45->modulus).v + 4);
  sStack_2b0.modulus.v._24_8_ = *(undefined8 *)((psVar45->modulus).v + 6);
  sStack_2b0.modulus.v._0_8_ = *(undefined8 *)(psVar45->modulus).v;
  sStack_2b0.modulus.v._8_8_ = *(undefined8 *)((psVar45->modulus).v + 2);
  sStack_270.modulus.v[8] = (psVar32->modulus).v[8];
  sStack_270.modulus.v._0_8_ = *(undefined8 *)(psVar32->modulus).v;
  sStack_270.modulus.v._8_8_ = *(undefined8 *)((psVar32->modulus).v + 2);
  psStack_288 = psVar32;
  sStack_270.modulus.v._16_8_ = *(undefined8 *)((psVar32->modulus).v + 4);
  sStack_270.modulus.v._24_8_ = *(undefined8 *)((psVar32->modulus).v + 6);
  iVar9 = 0;
  uVar42 = 0xffffffff;
  psStack_2d8 = psVar45;
  do {
    uStack_278 = (ulong)sStack_2b0.modulus.v[0];
    uVar25 = (ulong)sStack_270.modulus.v[0];
    uVar13 = 0;
    psVar32 = (secp256k1_modinv32_modinfo *)0x1;
    uVar27 = 0;
    uVar4 = 0;
    uVar41 = 1;
    uVar36 = sStack_270.modulus.v[0];
    uVar38 = sStack_2b0.modulus.v[0];
    do {
      uVar10 = sStack_2b0.modulus.v[0];
      iStack_2cc = iVar9;
      if ((uVar38 & 1) == 0) {
        psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cbf;
        secp256k1_modinv32_cold_17();
LAB_00153cbf:
        psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cc4;
        secp256k1_modinv32_cold_1();
LAB_00153cc4:
        psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cc9;
        secp256k1_modinv32_cold_2();
        psVar45 = unaff_R13;
LAB_00153cc9:
        uVar41 = uVar10;
        psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cce;
        secp256k1_modinv32_cold_16();
        goto LAB_00153cce;
      }
      uVar19 = (uint)psVar32;
      uVar31 = uVar27 * sStack_270.modulus.v[0] + uVar19 * sStack_2b0.modulus.v[0];
      psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uVar31;
      uVar44 = uVar38 << ((byte)uVar13 & 0x1f);
      psVar22 = (secp256k1_modinv32_modinfo *)(ulong)uVar44;
      if (uVar31 != uVar44) goto LAB_00153cbf;
      uVar31 = uVar41 * sStack_270.modulus.v[0] + uVar4 * sStack_2b0.modulus.v[0];
      psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uVar31;
      uVar44 = uVar36 << ((byte)uVar13 & 0x1f);
      psVar22 = (secp256k1_modinv32_modinfo *)(ulong)uVar44;
      if (uVar31 != uVar44) goto LAB_00153cc4;
      uStack_2c4 = (int)(uint)uVar42 >> 0x1f;
      psVar21 = (secp256k1_modinv32_modinfo *)(ulong)uStack_2c4;
      uStack_2c8 = uVar36 & 1;
      uVar44 = -uStack_2c8;
      psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar44;
      uVar31 = uStack_2c4 & uVar44;
      psVar22 = (secp256k1_modinv32_modinfo *)(ulong)uVar31;
      uVar50 = (uint)uVar42 ^ uVar31;
      uVar42 = (ulong)uVar50;
      psVar45 = (secp256k1_modinv32_modinfo *)(ulong)(uVar50 - 0x25b);
      if (uVar50 - 0x25b < 0xfffffb4d) goto LAB_00153cc9;
      uVar42 = (ulong)(uVar50 - 1);
      uVar41 = uVar41 + ((uStack_2c4 ^ uVar27) - uStack_2c4 & uVar44);
      uVar27 = (uVar27 + (uVar41 & uVar31)) * 2;
      uVar4 = uVar4 + ((uStack_2c4 ^ uVar19) - uStack_2c4 & uVar44);
      uVar10 = (uVar19 + (uVar4 & uVar31)) * 2;
      psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
      uVar44 = ((uStack_2c4 ^ uVar38) - uStack_2c4 & uVar44) + uVar36;
      uVar36 = uVar44 >> 1;
      uVar44 = uVar44 & uVar31;
      unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar44;
      uVar38 = uVar38 + uVar44;
      uVar44 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar44;
    } while (uVar44 != 0x1e);
    psVar21 = (secp256k1_modinv32_modinfo *)(long)(int)uVar10;
    psVar45 = (secp256k1_modinv32_modinfo *)(long)(int)uVar27;
    psVar52 = (secp256k1_modinv32_modinfo *)(long)(int)uVar4;
    uVar13 = (long)psVar21 * (long)(int)uVar41 - (long)psVar45 * (long)psVar52;
    sStack_2c0.u = uVar10;
    sStack_2c0.v = uVar27;
    sStack_2c0.q = uVar4;
    sStack_2c0.r = uVar41;
    if (uVar13 != 0x40000000) {
LAB_00153cce:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cd3;
      secp256k1_modinv32_cold_3();
LAB_00153cd3:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cd8;
      secp256k1_modinv32_cold_15();
LAB_00153cd8:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cdd;
      secp256k1_modinv32_cold_14();
LAB_00153cdd:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153ce2;
      secp256k1_modinv32_cold_13();
LAB_00153ce2:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153ce7;
      secp256k1_modinv32_cold_12();
LAB_00153ce7:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cec;
      secp256k1_modinv32_cold_4();
LAB_00153cec:
      unaff_R13 = psVar45;
      uVar27 = (uint)uVar13;
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cf1;
      secp256k1_modinv32_cold_5();
LAB_00153cf1:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cf6;
      secp256k1_modinv32_cold_11();
LAB_00153cf6:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153cfb;
      secp256k1_modinv32_cold_10();
LAB_00153cfb:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153d00;
      secp256k1_modinv32_cold_9();
LAB_00153d00:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153d05;
      secp256k1_modinv32_cold_8();
      goto LAB_00153d05;
    }
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x1539f3;
    lStack_280 = (long)(int)uVar41;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_240,
               (secp256k1_modinv32_signed30 *)(auStack_240 + 0x24),&sStack_2c0,psStack_2d8);
    psVar22 = &sStack_2b0;
    uVar41 = 9;
    uVar13 = 0xffffffff;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153a0f;
    psVar32 = psVar22;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar22->modulus,9,&psStack_2d8->modulus,-1);
    if (iVar9 < 1) goto LAB_00153cd3;
    uVar41 = 9;
    uVar13 = 1;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153a2e;
    psVar32 = psVar22;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar22->modulus,9,&psStack_2d8->modulus,1);
    if (0 < iVar9) goto LAB_00153cd8;
    psVar22 = &sStack_270;
    uVar41 = 9;
    uVar13 = 0xffffffff;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153a52;
    psVar32 = psVar22;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar22->modulus,9,&psStack_2d8->modulus,-1);
    if (iVar9 < 1) goto LAB_00153cdd;
    uVar41 = 9;
    uVar13 = 1;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153a71;
    psVar32 = psVar22;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar22->modulus,9,&psStack_2d8->modulus,1);
    unaff_R13 = psStack_2d8;
    if (-1 < iVar9) goto LAB_00153ce2;
    psVar22 = (secp256k1_modinv32_modinfo *)((long)psVar45 * uVar25 + (long)psVar21 * uStack_278);
    uVar13 = uStack_278;
    if (((ulong)psVar22 & 0x3ffffffe) != 0) goto LAB_00153ce7;
    uVar13 = uStack_278 * (long)psVar52;
    uVar25 = uVar25 * lStack_280 + uVar13;
    if ((uVar25 & 0x3fffffff) != 0) goto LAB_00153cec;
    uVar25 = (long)uVar25 >> 0x1e;
    psVar22 = (secp256k1_modinv32_modinfo *)((long)psVar22 >> 0x1e);
    lVar7 = 1;
    do {
      lVar14 = (long)sStack_2b0.modulus.v[lVar7];
      lVar15 = (long)sStack_270.modulus.v[lVar7];
      lVar17 = (long)(psVar22->modulus).v + lVar15 * (long)psVar45 + lVar14 * (long)psVar21;
      lVar14 = lVar15 * lStack_280 + lVar14 * (long)psVar52 + uVar25;
      sStack_2b0.modulus.v[lVar7 + -1] = (uint)lVar17 & 0x3fffffff;
      *(uint *)((long)&uStack_278 + lVar7 * 4 + 4) = (uint)lVar14 & 0x3fffffff;
      lVar7 = lVar7 + 1;
      uVar25 = lVar14 >> 0x1e;
      psVar22 = (secp256k1_modinv32_modinfo *)(lVar17 >> 0x1e);
    } while (lVar7 != 9);
    sStack_270.modulus.v[8] = (int32_t)uVar25;
    psVar21 = &sStack_2b0;
    uVar41 = 9;
    uVar27 = 0xffffffff;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153b43;
    psVar32 = psVar21;
    sStack_2b0.modulus.v[8] = (int32_t)psVar22;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&psStack_2d8->modulus,-1);
    if (iVar9 < 1) goto LAB_00153cf1;
    uVar41 = 9;
    uVar27 = 1;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153b60;
    psVar32 = psVar21;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&unaff_R13->modulus,1);
    if (0 < iVar9) goto LAB_00153cf6;
    psVar21 = &sStack_270;
    uVar41 = 9;
    uVar27 = 0xffffffff;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153b82;
    psVar32 = psVar21;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&unaff_R13->modulus,-1);
    if (iVar9 < 1) goto LAB_00153cfb;
    uVar41 = 9;
    uVar27 = 1;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153b9f;
    psVar32 = psVar21;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&unaff_R13->modulus,1);
    if (-1 < iVar9) goto LAB_00153d00;
    iVar9 = iStack_2cc + 1;
  } while (iVar9 != 0x14);
  psVar32 = &sStack_270;
  uVar41 = 9;
  uVar27 = 0;
  psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153bce;
  iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar9 == 0) {
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153bf1;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_2b0.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar21 = psStack_288;
    if (iVar9 == 0) {
LAB_00153c79:
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153c8e;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_240,(int32_t)psVar22,unaff_R13);
      (psVar21->modulus).v[8] = auStack_240._32_4_;
      *(undefined8 *)((psVar21->modulus).v + 4) = auStack_240._16_8_;
      *(undefined8 *)((psVar21->modulus).v + 6) = auStack_240._24_8_;
      *(undefined8 *)(psVar21->modulus).v = auStack_240._0_8_;
      *(undefined8 *)((psVar21->modulus).v + 2) = auStack_240._8_8_;
      return (ulong)(uint)auStack_240._32_4_;
    }
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153c15;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&sStack_2b0.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar9 == 0) goto LAB_00153c79;
    uVar41 = 9;
    uVar27 = 0;
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153c2f;
    psVar32 = psVar21;
    iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar21->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar9 == 0) {
      psVar32 = (secp256k1_modinv32_modinfo *)auStack_240;
      uVar41 = 9;
      uVar27 = 0;
      psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153c52;
      iVar9 = secp256k1_modinv32_mul_cmp_30
                        ((secp256k1_modinv32_signed30 *)psVar32,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar9 == 0) {
        psVar32 = &sStack_2b0;
        uVar41 = 9;
        uVar27 = 1;
        psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153c71;
        iVar9 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&unaff_R13->modulus,1);
        if (iVar9 == 0) goto LAB_00153c79;
      }
    }
  }
  else {
LAB_00153d05:
    psStack_2e8 = (secp256k1_modinv32_modinfo *)0x153d0a;
    secp256k1_modinv32_cold_6();
  }
  psStack_2e8 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_338;
  piVar23 = (int *)(ulong)uVar27;
  pcStack_340 = (code *)0x153d2f;
  psStack_2f0 = psVar22;
  psStack_2e8 = psVar21;
  secp256k1_modinv32_mul_30(&sStack_314,&psVar32->modulus,uVar41,1);
  pcStack_340 = (code *)0x153d41;
  piVar40 = piVar23;
  psVar28 = a_00;
  secp256k1_modinv32_mul_30(&sStack_338,a_00,9,uVar27);
  lVar7 = 0;
  while ((uint)sStack_314.v[lVar7] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_338.v[lVar7]) goto LAB_00153d93;
    lVar7 = lVar7 + 1;
    if (lVar7 == 8) {
      uVar27 = 8;
      while( true ) {
        if (sStack_314.v[uVar27] < sStack_338.v[uVar27]) {
          return 0xffffffff;
        }
        if (sStack_338.v[uVar27] < sStack_314.v[uVar27]) break;
        bVar55 = uVar27 == 0;
        uVar27 = uVar27 - 1;
        if (bVar55) {
          return 0;
        }
      }
      return 1;
    }
  }
  pcStack_340 = (code *)0x153d93;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00153d93:
  pcStack_340 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar9 = (int)a_01;
  piStack_368 = piVar23;
  uStack_360 = uVar42;
  psStack_358 = unaff_R13;
  psStack_348 = psVar52;
  pcStack_340 = (code *)uVar25;
  if (iVar9 < 1) {
    psStack_378 = (secp256k1_modinv32_signed30 *)0x153e86;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00153e86:
    iVar12 = (int)piVar40;
    psStack_378 = (secp256k1_modinv32_signed30 *)0x153e8b;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar11 = piVar40[1];
    iVar1 = *piVar40;
    piVar23 = (int *)(long)psVar28->v[0];
    uVar13 = (long)*extraout_RDX * (long)iVar11 + (long)piVar23 * (long)iVar1;
    if ((uVar13 & 0x3fffffff) != 0) goto LAB_00153e86;
    iVar2 = piVar40[3];
    iVar12 = piVar40[2];
    piVar23 = (int *)((long)piVar23 * (long)iVar12);
    piVar40 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar23);
    if (((ulong)piVar40 & 0x3fffffff) == 0) {
      lVar7 = (long)piVar40 >> 0x1e;
      uVar6 = (long)uVar13 >> 0x1e;
      if (iVar9 != 1) {
        uVar42 = 1;
        do {
          lVar14 = (long)extraout_RDX[uVar42] * (long)iVar11 +
                   (long)psVar28->v[uVar42] * (long)iVar1 + uVar6;
          lVar7 = (long)extraout_RDX[uVar42] * (long)iVar2 +
                  (long)psVar28->v[uVar42] * (long)iVar12 + lVar7;
          psVar28->v[uVar42 - 1] = (uint)lVar14 & 0x3fffffff;
          extraout_RDX[uVar42 - 1] = (uint)lVar7 & 0x3fffffff;
          uVar42 = uVar42 + 1;
          lVar7 = lVar7 >> 0x1e;
          uVar6 = lVar14 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar42);
      }
      psVar28->v[(long)iVar9 + -1] = (int32_t)uVar6;
      extraout_RDX[(long)iVar9 + -1] = (int)lVar7;
      return uVar6;
    }
  }
  psStack_378 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar7 = 0;
  psStack_378 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar7 < extraout_EDX) {
      psStack_378 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_378->v + (long)psVar28->v[lVar7] * (long)iVar12);
    }
    a_01->v[lVar7] = (uint)psStack_378 & 0x3fffffff;
    psStack_378 = (secp256k1_modinv32_signed30 *)((long)psStack_378 >> 0x1e);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  if (8 < extraout_EDX) {
    psStack_378 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_378->v + (long)psVar28->v[8] * (long)iVar12);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_378;
  if (b == psStack_378) {
    a_01->v[8] = (int)psStack_378;
    return (uint64_t)psStack_378;
  }
  pcStack_380 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar27 = *extraout_RDX_00;
  psVar46 = (secp256k1_modinv32_signed30 *)(long)(int)uVar27;
  uVar36 = extraout_RDX_00[1];
  lVar7 = (long)(int)uVar36;
  uVar38 = extraout_RDX_00[2];
  psVar24 = (secp256k1_modinv32_signed30 *)(long)(int)uVar38;
  lStack_3b8 = (long)(int)extraout_RDX_00[3];
  psVar29 = (secp256k1_fe *)0x9;
  pcStack_3c8 = (code *)0x153f25;
  a_02 = a_01;
  piStack_3a8 = piVar23;
  uStack_3a0 = uVar42;
  psStack_398 = unaff_R13;
  psStack_388 = psVar52;
  pcStack_380 = (code *)uVar25;
  iVar9 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar9 < 1) {
    pcStack_3c8 = (code *)0x15418d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0015418d:
    pcStack_3c8 = (code *)0x154192;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00154192:
    pcStack_3c8 = (code *)0x154197;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00154197:
    pcStack_3c8 = (code *)0x15419c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015419c:
    pcStack_3c8 = (code *)0x1541a1;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001541a1:
    pcStack_3c8 = (code *)0x1541a6;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001541a6:
    pcStack_3c8 = (code *)0x1541ab;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001541ab:
    pcStack_3c8 = (code *)0x1541b0;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar43 = b;
LAB_001541b0:
    pcStack_3c8 = (code *)0x1541b5;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001541b5:
    pcStack_3c8 = (code *)0x1541ba;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001541ba:
    pcStack_3c8 = (code *)0x1541bf;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x153f42;
    a_02 = a_01;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar9) goto LAB_0015418d;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x153f5f;
    a_02 = psVar28;
    iVar9 = secp256k1_modinv32_mul_cmp_30(psVar28,9,b,-2);
    if (iVar9 < 1) goto LAB_00154192;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x153f7c;
    a_02 = psVar28;
    iVar9 = secp256k1_modinv32_mul_cmp_30(psVar28,9,b,1);
    if (-1 < iVar9) goto LAB_00154197;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar46;
    if (0 < (long)psVar46) {
      psVar43 = psVar46;
    }
    lVar14 = -lVar7;
    if (lVar7 < 1) {
      lVar14 = lVar7;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_0015419c;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar24;
    if (0 < (long)psVar24) {
      psVar43 = psVar24;
    }
    lVar14 = -lStack_3b8;
    if (lStack_3b8 < 1) {
      lVar14 = lStack_3b8;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_001541a1;
    uVar41 = a_01->v[8] >> 0x1f;
    uVar4 = psVar28->v[8] >> 0x1f;
    psVar29 = (secp256k1_fe *)(ulong)uVar4;
    iVar9 = (uVar4 & uVar36) + (uVar41 & uVar27);
    a_02 = (secp256k1_modinv32_signed30 *)(psVar28->v[0] * lVar7 + (long)a_01->v[0] * (long)psVar46)
    ;
    lVar14 = (long)(int)(iVar9 - ((int)a_02 * b[1].v[0] + iVar9 & 0x3fffffffU));
    piVar16 = (int32_t *)((long)a_02->v + lVar14 * b->v[0]);
    if (((ulong)piVar16 & 0x3fffffff) != 0) goto LAB_001541a6;
    lStack_3b0 = lVar14;
    iVar9 = (uVar4 & (uint)lStack_3b8) + (uVar41 & uVar38);
    lVar15 = psVar28->v[0] * lStack_3b8 + (long)a_01->v[0] * (long)psVar24;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar27 = iVar9 - (b[1].v[0] * (int)lVar15 + iVar9 & 0x3fffffffU);
    psVar29 = (secp256k1_fe *)(ulong)uVar27;
    uVar42 = (long)b->v[0] * (long)(int)uVar27 + lVar15;
    if ((uVar42 & 0x3fffffff) != 0) goto LAB_001541ab;
    lVar15 = (long)uVar42 >> 0x1e;
    lVar17 = (long)piVar16 >> 0x1e;
    lVar33 = 1;
    do {
      lVar17 = b->v[lVar33] * lVar14 + psVar28->v[lVar33] * lVar7 +
               (long)a_01->v[lVar33] * (long)psVar46 + lVar17;
      psVar43 = (secp256k1_modinv32_signed30 *)(psVar28->v[lVar33] * lStack_3b8);
      lVar15 = (long)psVar43->v +
               (long)a_01->v[lVar33] * (long)psVar24 + lVar15 +
               (long)b->v[lVar33] * (long)(int)uVar27;
      a_01->v[lVar33 + -1] = (uint)lVar17 & 0x3fffffff;
      psVar28->v[lVar33 + -1] = (uint)lVar15 & 0x3fffffff;
      lVar33 = lVar33 + 1;
      lVar15 = lVar15 >> 0x1e;
      lVar17 = lVar17 >> 0x1e;
    } while (lVar33 != 9);
    a_01->v[8] = (int32_t)lVar17;
    psVar28->v[8] = (int32_t)lVar15;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x154126;
    a_02 = a_01;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar24 = psVar28;
    psVar46 = b;
    if (iVar9 < 1) goto LAB_001541b0;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x154143;
    a_02 = a_01;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar9) goto LAB_001541b5;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x15415c;
    a_02 = psVar28;
    iVar9 = secp256k1_modinv32_mul_cmp_30(psVar28,9,b,-2);
    if (iVar9 < 1) goto LAB_001541ba;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_3c8 = (code *)0x154175;
    a_02 = psVar28;
    iVar9 = secp256k1_modinv32_mul_cmp_30(psVar28,9,b,1);
    if (iVar9 < 0) {
      return CONCAT44(extraout_var,iVar9);
    }
  }
  pcStack_3c8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_3c8 = (code *)lVar7;
  psStack_3d0 = a_01;
  psStack_3d8 = psVar28;
  psStack_3e0 = psVar46;
  psStack_3e8 = psVar43;
  psStack_3f0 = psVar24;
  uVar27 = a_02->v[0];
  uVar30 = (ulong)uVar27;
  uVar36 = a_02->v[3];
  uVar18 = (ulong)uVar36;
  uVar38 = a_02->v[4];
  uVar13 = (ulong)uVar38;
  uVar4 = a_02->v[5];
  uVar25 = (ulong)uVar4;
  psVar28 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar41 = a_02->v[7];
  uVar42 = (ulong)uVar41;
  iStack_3f4 = a_02->v[8];
  lVar7 = 0;
  do {
    if (a_02->v[lVar7] < -0x3fffffff) {
      pcStack_430 = (code *)0x15450d;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0015450d:
      pcStack_430 = (code *)0x154512;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00154512;
    }
    if (0x3fffffff < a_02->v[lVar7]) goto LAB_0015450d;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 9);
  uStack_414 = (uint)psVar29;
  psVar29 = (secp256k1_fe *)0x9;
  pcStack_430 = (code *)0x15424a;
  psVar28 = a_02;
  uStack_420 = a_02->v[1];
  uStack_41c = a_02->v[2];
  uStack_418 = a_02->v[6];
  psStack_410 = b_00;
  iVar9 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar9 < 1) {
LAB_00154512:
    pcStack_430 = (code *)0x154517;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_00154517:
    pcStack_430 = (code *)0x15451c;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015451c:
    pcStack_430 = (code *)0x154521;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00154521:
    pcStack_430 = (code *)0x154526;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_430 = (code *)0x154269;
    psVar28 = a_02;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_410,1);
    if (-1 < iVar9) goto LAB_00154517;
    uVar10 = iStack_3f4 >> 0x1f;
    uStack_3f8 = psStack_410->v[1];
    uVar44 = (uVar10 & uStack_3f8) + uStack_420;
    uStack_420 = psStack_410->v[2];
    uVar19 = (uVar10 & uStack_420) + uStack_41c;
    uStack_41c = psStack_410->v[3];
    uStack_3fc = psStack_410->v[4];
    uStack_400 = psStack_410->v[5];
    uStack_404 = psStack_410->v[6];
    uVar20 = (uVar10 & uStack_404) + uStack_418;
    uStack_418 = psStack_410->v[7];
    uStack_424 = (int)uStack_414 >> 0x1f;
    uStack_414 = psStack_410->v[8];
    uVar50 = ((uVar10 & psStack_410->v[0]) + uVar27 ^ uStack_424) - uStack_424;
    uVar31 = ((int)uVar50 >> 0x1e) + ((uVar44 ^ uStack_424) - uStack_424);
    uVar44 = ((int)uVar31 >> 0x1e) + ((uVar19 ^ uStack_424) - uStack_424);
    uVar51 = ((int)uVar44 >> 0x1e) + (((uVar10 & uStack_41c) + uVar36 ^ uStack_424) - uStack_424);
    uVar36 = ((int)uVar51 >> 0x1e) + (((uVar10 & uStack_3fc) + uVar38 ^ uStack_424) - uStack_424);
    uVar27 = ((int)uVar36 >> 0x1e) + (((uVar10 & uStack_400) + uVar4 ^ uStack_424) - uStack_424);
    uVar38 = ((int)uVar27 >> 0x1e) + ((uVar20 ^ uStack_424) - uStack_424);
    uVar4 = ((int)uVar38 >> 0x1e) + (((uVar10 & uStack_418) + uVar41 ^ uStack_424) - uStack_424);
    uVar47 = ((int)uVar4 >> 0x1e) + (((uVar10 & uStack_414) + iStack_3f4 ^ uStack_424) - uStack_424)
    ;
    uVar25 = (ulong)uVar47;
    uStack_428 = (int)uVar47 >> 0x1f;
    uVar20 = (psStack_410->v[0] & uStack_428) + (uVar50 & 0x3fffffff);
    uVar19 = (uStack_400 & uStack_428) + (uVar27 & 0x3fffffff);
    uVar30 = (ulong)uVar19;
    uVar50 = (uStack_404 & uStack_428) + (uVar38 & 0x3fffffff);
    uVar18 = (ulong)uVar50;
    uVar27 = ((int)uVar20 >> 0x1e) + (uStack_3f8 & uStack_428) + (uVar31 & 0x3fffffff);
    uVar38 = ((int)uVar27 >> 0x1e) + (uStack_420 & uStack_428) + (uVar44 & 0x3fffffff);
    uVar41 = ((int)uVar38 >> 0x1e) + (uStack_41c & uStack_428) + (uVar51 & 0x3fffffff);
    uVar10 = ((int)uVar41 >> 0x1e) + (uStack_3fc & uStack_428) + (uVar36 & 0x3fffffff);
    uVar19 = ((int)uVar10 >> 0x1e) + uVar19;
    uVar50 = ((int)uVar19 >> 0x1e) + uVar50;
    uVar36 = ((int)uVar50 >> 0x1e) + (uStack_418 & uStack_428) + (uVar4 & 0x3fffffff);
    uVar4 = ((int)uVar36 >> 0x1e) + (uStack_414 & uStack_428) + uVar47;
    uVar13 = (ulong)uVar4;
    uVar41 = uVar41 & 0x3fffffff;
    psVar29 = (secp256k1_fe *)(ulong)uVar41;
    uVar10 = uVar10 & 0x3fffffff;
    psVar28 = (secp256k1_modinv32_signed30 *)(ulong)uVar10;
    uVar36 = uVar36 & 0x3fffffff;
    uVar42 = (ulong)uVar36;
    a_02->v[0] = uVar20 & 0x3fffffff;
    a_02->v[1] = uVar27 & 0x3fffffff;
    a_02->v[2] = uVar38 & 0x3fffffff;
    a_02->v[3] = uVar41;
    a_02->v[4] = uVar10;
    a_02->v[5] = uVar19 & 0x3fffffff;
    a_02->v[6] = uVar50 & 0x3fffffff;
    a_02->v[7] = uVar36;
    a_02->v[8] = uVar4;
    if (0x3fffffff < uVar4) goto LAB_0015451c;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_430 = (code *)0x1544da;
    psVar28 = a_02;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_410,0);
    if (iVar9 < 0) goto LAB_00154521;
    psVar29 = (secp256k1_fe *)0x9;
    pcStack_430 = (code *)0x1544f5;
    psVar28 = a_02;
    iVar9 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_410,1);
    if (iVar9 < 0) {
      return CONCAT44(extraout_var_00,iVar9);
    }
  }
  pcStack_430 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_4c8 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_4c8 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_518 = (code *)0x154562;
  uStack_458 = uVar42;
  uStack_450 = uVar25;
  uStack_448 = uVar18;
  psStack_440 = a_02;
  uStack_438 = uVar30;
  pcStack_430 = (code *)uVar13;
  (*(code *)psStack_4c8)(&sStack_500);
  if (psVar28 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar28->v + 8) = sStack_500.n[4];
    *(ulong *)(psVar28[1].v + 1) = CONCAT44(sStack_500.normalized,sStack_500.magnitude);
    *(uint64_t *)(psVar28->v + 4) = sStack_500.n[2];
    *(uint64_t *)(psVar28->v + 6) = sStack_500.n[3];
    *(uint64_t *)psVar28->v = sStack_500.n[0];
    *(uint64_t *)(psVar28->v + 2) = sStack_500.n[1];
  }
  uVar53 = 0xfffffffffffff;
  uVar6 = 0xf000000000000;
  uVar13 = 0xffffffffffff;
  uVar25 = 0x1000003d0;
  sStack_490.n[0] = psVar29->n[0];
  sStack_490.n[1] = psVar29->n[1];
  sStack_490.n[2] = psVar29->n[2];
  sStack_490.n[3] = psVar29->n[3];
  sStack_490.n[4] = psVar29->n[4];
  sStack_490.magnitude = psVar29->magnitude;
  sStack_490.normalized = psVar29->normalized;
  a_03 = &sStack_490;
  pcStack_518 = (code *)0x1545d9;
  secp256k1_fe_verify(a_03);
  lStack_508 = 0x1000003d1;
  uVar42 = (sStack_490.n[4] >> 0x30) * 0x1000003d1 + sStack_490.n[0];
  if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
    uVar18 = (uVar42 >> 0x34) + sStack_490.n[1];
    uVar30 = (uVar18 >> 0x34) + sStack_490.n[2];
    uVar34 = (uVar30 >> 0x34) + sStack_490.n[3];
    uVar37 = (uVar34 >> 0x34) + (sStack_490.n[4] & 0xffffffffffff);
    if ((((uVar18 | uVar42 | uVar30 | uVar34) & 0xfffffffffffff) != 0 || uVar37 != 0) &&
       (((uVar42 | 0x1000003d0) & uVar18 & uVar30 & uVar34 & (uVar37 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015467c;
LAB_00154a90:
    psVar29 = &sStack_500;
    pcStack_518 = (code *)0x154a9d;
    secp256k1_fe_verify(psVar29);
    uVar13 = uVar13 & sStack_500.n[4];
    uVar42 = (sStack_500.n[4] >> 0x30) * lStack_508 + sStack_500.n[0];
    uVar18 = (uVar42 >> 0x34) + sStack_500.n[1];
    uVar30 = (uVar18 >> 0x34) + sStack_500.n[2];
    r = (secp256k1_fe *)((uVar30 >> 0x34) + sStack_500.n[3]);
    uVar34 = ((ulong)r >> 0x34) + uVar13;
    if (((uVar18 | uVar42 | uVar30 | (ulong)r) & uVar53) == 0 && uVar34 == 0) {
      return uVar42;
    }
    r_00 = (secp256k1_fe *)(uVar34 ^ uVar6);
    uVar42 = (uVar42 ^ uVar25) & uVar18 & uVar30 & (ulong)r & (ulong)r_00;
    if (uVar42 == uVar53) {
      return uVar42;
    }
  }
  else {
LAB_0015467c:
    pcStack_518 = (code *)0x154694;
    r = psVar29;
    secp256k1_fe_mul(&sStack_490,psVar29,&sStack_500);
    pcStack_518 = (code *)0x15469c;
    secp256k1_fe_verify(&sStack_490);
    r_00 = &fe_minus_one;
    pcStack_518 = (code *)0x1546a8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_490.magnitude < 0x20) {
      sStack_490.n[0] = sStack_490.n[0] + 0xffffefffffc2e;
      sStack_490.n[1] = sStack_490.n[1] + 0xfffffffffffff;
      sStack_490.n[2] = sStack_490.n[2] + 0xfffffffffffff;
      sStack_490.n[3] = sStack_490.n[3] + 0xfffffffffffff;
      sStack_490.n[4] = sStack_490.n[4] + 0xffffffffffff;
      sStack_490.normalized = 0;
      sStack_490.magnitude = sStack_490.magnitude + 1;
      pcStack_518 = (code *)0x1546fd;
      secp256k1_fe_verify(&sStack_490);
      pcStack_518 = (code *)0x154705;
      secp256k1_fe_verify(&sStack_490);
      uVar42 = (sStack_490.n[4] >> 0x30) * lStack_508 + sStack_490.n[0];
      uVar13 = (uVar42 >> 0x34) + sStack_490.n[1];
      uVar18 = (uVar13 >> 0x34) + sStack_490.n[2];
      r = (secp256k1_fe *)((uVar18 >> 0x34) + sStack_490.n[3]);
      uVar30 = ((ulong)r >> 0x34) + (sStack_490.n[4] & 0xffffffffffff);
      if ((((uVar13 | uVar42 | uVar18 | (ulong)r) & 0xfffffffffffff) != 0 || uVar30 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar30 ^ 0xf000000000000),
         ((uVar42 ^ 0x1000003d0) & uVar13 & uVar18 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00154b1e;
      sStack_4c0.n[0] = psVar29->n[0];
      sStack_4c0.n[1] = psVar29->n[1];
      sStack_4c0.n[2] = psVar29->n[2];
      sStack_4c0.n[3] = psVar29->n[3];
      sStack_4c0.n[4] = psVar29->n[4];
      sStack_4c0.magnitude = psVar29->magnitude;
      sStack_4c0.normalized = psVar29->normalized;
      psVar29 = &sStack_4c0;
      pcStack_518 = (code *)0x15479d;
      secp256k1_fe_verify(psVar29);
      r_00 = &fe_minus_one;
      pcStack_518 = (code *)0x1547a9;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4c0.magnitude) goto LAB_00154b23;
      uVar26 = sStack_4c0.n[0] + 0xffffefffffc2e;
      uVar49 = sStack_4c0.n[1] + 0xfffffffffffff;
      uVar53 = sStack_4c0.n[2] + 0xfffffffffffff;
      uVar6 = sStack_4c0.n[3] + 0xfffffffffffff;
      uVar25 = sStack_4c0.n[4] + 0xffffffffffff;
      sStack_4c0.normalized = 0;
      sStack_4c0.magnitude = sStack_4c0.magnitude + 1;
      pcStack_518 = (code *)0x15481e;
      sStack_4c0.n[0] = uVar26;
      sStack_4c0.n[1] = uVar49;
      sStack_4c0.n[2] = uVar53;
      sStack_4c0.n[3] = uVar6;
      sStack_4c0.n[4] = uVar25;
      secp256k1_fe_verify(&sStack_4c0);
      pcStack_518 = (code *)0x154826;
      secp256k1_fe_verify(&sStack_4c0);
      a_03 = psStack_4c8;
      uVar42 = (uVar25 >> 0x30) * lStack_508 + uVar26;
      if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
        uVar25 = uVar25 & 0xffffffffffff;
        uVar34 = uVar49 + (uVar42 >> 0x34);
        uVar13 = (uVar34 >> 0x34) + uVar53;
        uVar18 = (uVar13 >> 0x34) + uVar6;
        uVar30 = (uVar18 >> 0x34) + uVar25;
        if (((uVar34 | uVar42 | uVar13 | uVar18) & 0xfffffffffffff) == 0 && uVar30 == 0) {
          return uVar42;
        }
        if (((uVar42 | 0x1000003d0) & uVar34 & uVar13 & uVar18 & (uVar30 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return 0xfffffffffffff;
        }
      }
      r = &sStack_4c0;
      pcStack_518 = (code *)0x1548e6;
      (*(code *)psStack_4c8)();
      psVar29 = &sStack_500;
      pcStack_518 = (code *)0x1548f3;
      secp256k1_fe_verify(psVar29);
      r_00 = &fe_minus_one;
      pcStack_518 = (code *)0x1548ff;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_500.magnitude) goto LAB_00154b28;
      psVar29 = &sStack_500;
      sStack_500.n[0] = sStack_500.n[0] + 0xffffefffffc2e;
      sStack_500.n[1] = sStack_500.n[1] + 0xfffffffffffff;
      sStack_500.n[2] = sStack_500.n[2] + 0xfffffffffffff;
      sStack_500.n[3] = sStack_500.n[3] + 0xfffffffffffff;
      sStack_500.n[4] = sStack_500.n[4] + 0xffffffffffff;
      sStack_500.magnitude = sStack_500.magnitude + 1;
      uVar13 = 0;
      sStack_500.normalized = 0;
      pcStack_518 = (code *)0x154948;
      secp256k1_fe_verify(psVar29);
      pcStack_518 = (code *)0x154951;
      r = psVar29;
      (*(code *)a_03)(psVar29);
      pcStack_518 = (code *)0x154959;
      secp256k1_fe_verify(psVar29);
      sStack_500.n[0] = sStack_500.n[0] + 1;
      sStack_500.magnitude = sStack_500.magnitude + 1;
      sStack_500.normalized = 0;
      pcStack_518 = (code *)0x15496a;
      secp256k1_fe_verify(psVar29);
      pcStack_518 = (code *)0x154972;
      secp256k1_fe_verify(psVar29);
      a_03 = &sStack_4c0;
      pcStack_518 = (code *)0x15497f;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_4c0.magnitude + sStack_500.magnitude < 0x21) {
        sStack_500.n[0] = sStack_500.n[0] + sStack_4c0.n[0];
        sStack_500.n[1] = sStack_500.n[1] + sStack_4c0.n[1];
        sStack_500.n[2] = sStack_500.n[2] + sStack_4c0.n[2];
        sStack_500.n[3] = sStack_500.n[3] + sStack_4c0.n[3];
        sStack_500.n[4] = sStack_500.n[4] + sStack_4c0.n[4];
        sStack_500.normalized = 0;
        pcStack_518 = (code *)0x1549cd;
        sStack_500.magnitude = sStack_4c0.magnitude + sStack_500.magnitude;
        secp256k1_fe_verify(&sStack_500);
        pcStack_518 = (code *)0x1549d5;
        secp256k1_fe_verify(&sStack_500);
        uVar42 = (sStack_500.n[4] >> 0x30) * lStack_508 + sStack_500.n[0];
        if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
          uVar18 = (uVar42 >> 0x34) + sStack_500.n[1];
          uVar30 = (uVar18 >> 0x34) + sStack_500.n[2];
          uVar34 = (uVar30 >> 0x34) + sStack_500.n[3];
          uVar37 = (uVar34 >> 0x34) + (sStack_500.n[4] & 0xffffffffffff);
          if (((uVar18 | uVar42 | uVar30 | uVar34) & 0xfffffffffffff) == 0 && uVar37 == 0) {
            return uVar42;
          }
          if (((uVar42 | 0x1000003d0) & uVar18 & uVar30 & uVar34 & (uVar37 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return 0xfffffffffffff;
          }
        }
        pcStack_518 = (code *)0x154a90;
        test_inverse_field_cold_2();
        goto LAB_00154a90;
      }
    }
    else {
      pcStack_518 = (code *)0x154b1e;
      test_inverse_field_cold_7();
LAB_00154b1e:
      pcStack_518 = (code *)0x154b23;
      test_inverse_field_cold_6();
LAB_00154b23:
      a_03 = &sStack_490;
      pcStack_518 = (code *)0x154b28;
      test_inverse_field_cold_5();
LAB_00154b28:
      uVar13 = 0xffffffffffff;
      pcStack_518 = (code *)0x154b2d;
      test_inverse_field_cold_4();
    }
    pcStack_518 = (code *)0x154b32;
    test_inverse_field_cold_3();
  }
  pcStack_518 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar35 = (secp256k1_fe *)auStack_588;
  pcVar54 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar54 = secp256k1_scalar_inverse;
  }
  pcStack_590 = (code *)0x154b60;
  auStack_548._32_8_ = psVar29;
  auStack_548._40_8_ = a_03;
  pcStack_518 = (code *)uVar53;
  (*pcVar54)(auStack_588);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_588._20_4_,auStack_588._16_4_);
    r_00->n[3] = CONCAT44(auStack_588._28_4_,auStack_588._24_4_);
    r_00->n[0] = CONCAT44(auStack_588._4_4_,auStack_588._0_4_);
    r_00->n[1] = CONCAT44(auStack_588._12_4_,auStack_588._8_4_);
  }
  pcStack_590 = (code *)0x154b7f;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar59._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar59._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar59._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar59._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar9 = movmskps(extraout_EAX,auVar59);
  if (iVar9 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_548;
    pcStack_590 = (code *)0x154bb3;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_588);
    pcStack_590 = (code *)0x154bbb;
    psVar29 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_548._0_8_ != 1 || auStack_548._8_8_ != 0) || auStack_548._16_8_ != 0) ||
        auStack_548._24_8_ != 0) {
      pcStack_590 = (code *)0x154cc5;
      test_inverse_scalar_cold_1();
      goto LAB_00154cc5;
    }
    pcStack_590 = (code *)0x154beb;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_588 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_590 = (code *)0x154bf3;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_588 + 0x20));
    auVar56._0_4_ = -(uint)(iStack_558 == 0 && auStack_588._32_4_ == 0);
    auVar56._4_4_ = -(uint)(iStack_554 == 0 && iStack_564 == 0);
    auVar56._8_4_ = -(uint)(iStack_550 == 0 && iStack_560 == 0);
    auVar56._12_4_ = -(uint)(iStack_54c == 0 && iStack_55c == 0);
    uVar27 = movmskps(extraout_EAX_00,auVar56);
    if ((uVar27 ^ 0xf) == 0) {
      return (ulong)(uVar27 ^ 0xf);
    }
    a = (secp256k1_scalar *)(auStack_588 + 0x20);
    pcStack_590 = (code *)0x154c24;
    (*pcVar54)(a,a);
    pcStack_590 = (code *)0x154c39;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_588,&scalar_minus_one,(secp256k1_scalar *)auStack_588);
    pcStack_590 = (code *)0x154c42;
    (*pcVar54)(auStack_588,auStack_588);
    pcStack_590 = (code *)0x154c54;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_588,(secp256k1_scalar *)auStack_588,&secp256k1_scalar_one
              );
    pcStack_590 = (code *)0x154c62;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_588,a,(secp256k1_scalar *)auStack_588);
    pcStack_590 = (code *)0x154c6a;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_588);
    auVar57._0_4_ = -(uint)(auStack_588._16_4_ == 0 && auStack_588._0_4_ == 0);
    auVar57._4_4_ = -(uint)(auStack_588._20_4_ == 0 && auStack_588._4_4_ == 0);
    auVar57._8_4_ = -(uint)(auStack_588._24_4_ == 0 && auStack_588._8_4_ == 0);
    auVar57._12_4_ = -(uint)(auStack_588._28_4_ == 0 && auStack_588._12_4_ == 0);
    uVar27 = movmskps(extraout_EAX_01,auVar57);
    if ((uVar27 ^ 0xf) == 0) {
      return (ulong)(uVar27 ^ 0xf);
    }
    pcStack_590 = (code *)0x154c8e;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_588;
  }
  pcStack_590 = (code *)0x154c99;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_588);
  auVar58._0_4_ = -(uint)(auStack_588._16_4_ == 0 && auStack_588._0_4_ == 0);
  auVar58._4_4_ = -(uint)(auStack_588._20_4_ == 0 && auStack_588._4_4_ == 0);
  auVar58._8_4_ = -(uint)(auStack_588._24_4_ == 0 && auStack_588._8_4_ == 0);
  auVar58._12_4_ = -(uint)(auStack_588._28_4_ == 0 && auStack_588._12_4_ == 0);
  uVar27 = movmskps(extraout_EAX_02,auVar58);
  r = (secp256k1_fe *)auStack_588;
  psVar29 = psVar35;
  if ((uVar27 ^ 0xf) == 0) {
    return (ulong)(uVar27 ^ 0xf);
  }
LAB_00154cc5:
  pcStack_590 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1640;
  psStack_5b8 = r;
  uStack_5b0 = uVar25;
  uStack_5a8 = uVar6;
  psStack_5a0 = r_00;
  pcStack_598 = pcVar54;
  pcStack_590 = (code *)uVar13;
  memset(__s,0,0x1081);
  uStack_1650 = 0;
  lVar7 = 0x41;
  psStack_1648 = psVar29;
  secp256k1_hsort(__s,0x41,(size_t)psVar29,test_hsort_cmp,&uStack_1650);
  if (0x3f < uStack_1650) {
    test_hsort_is_sorted(auStack_1640,0x41,(size_t)psVar29);
    uVar6 = extraout_RAX;
    if (0 < COUNT) {
      iVar9 = 0;
      do {
        uVar5 = testrand_int(0x41);
        count = (size_t)(int)uVar5;
        testrand_bytes_test(auStack_1640,count * (long)psVar29);
        secp256k1_hsort(auStack_1640,count,(size_t)psVar29,test_hsort_cmp,&uStack_1650);
        test_hsort_is_sorted(auStack_1640,count,(size_t)psVar29);
        iVar9 = iVar9 + 1;
        uVar6 = extraout_RAX_00;
      } while (iVar9 < COUNT);
    }
    return uVar6;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar14 = 0;
    do {
      uVar27 = (uint)__s[lVar14] - (uint)*(byte *)(lVar7 + lVar14);
      if (uVar27 != 0) {
        return (ulong)uVar27;
      }
      lVar14 = lVar14 + 1;
    } while (extraout_RDX_01[1] != lVar14);
  }
  return 0;
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}